

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_types.cpp
# Opt level: O0

void __thiscall ArchiveSpanFallback_Write_Test::TestBody(ArchiveSpanFallback_Write_Test *this)

{
  mock_fallback_policy *this_00;
  MockSpec<pstore::serialize::archive::void_type_(const_int_&)> *this_01;
  TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)> *pTVar1;
  MockSpec<void_(int_&)> *this_02;
  TypedExpectation<void_(int_&)> *this_03;
  char *pcVar2;
  span<int,__1L> sp;
  archive_type *local_198;
  extent_type<_1L> local_190;
  undefined1 local_188 [8];
  array<int,_3UL> arr;
  MockSpec<void_(int_&)> local_160;
  ReturnAction<pstore::serialize::archive::void_type> local_138;
  Action<pstore::serialize::archive::void_type_(const_int_&)> local_128;
  WithoutMatchers local_105 [13];
  Matcher<const_int_&> local_f8;
  MockSpec<pstore::serialize::archive::void_type_(const_int_&)> local_e0;
  undefined1 local_b9;
  undefined1 local_b8 [7];
  void_type ret;
  archive_type archive;
  ArchiveSpanFallback_Write_Test *this_local;
  
  anon_unknown.dwarf_54ed9::ArchiveSpanFallback::archive_type::archive_type
            ((archive_type *)local_b8);
  local_b9 = 0;
  this_00 = pstore::serialize::archive::
            writer_base<(anonymous_namespace)::ArchiveSpanFallback::mock_fallback_policy>::
            writer_policy((writer_base<(anonymous_namespace)::ArchiveSpanFallback::mock_fallback_policy>
                           *)local_b8);
  testing::Matcher<int_const&>::Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<int_const&> *)&local_f8,(AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_54ed9::ArchiveSpanFallback::mock_fallback_policy::gmock_put
            (&local_e0,this_00,&local_f8);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<pstore::serialize::archive::void_type_(const_int_&)>::
            operator()(&local_e0,local_105,(void *)0x0);
  pTVar1 = testing::internal::MockSpec<pstore::serialize::archive::void_type_(const_int_&)>::
           InternalExpectedAt(this_01,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                              ,0xf4,"archive.writer_policy ()","put (_)");
  pTVar1 = testing::internal::TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)>
           ::Times(pTVar1,3);
  testing::Return<pstore::serialize::archive::void_type>(&local_138);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_128,(ReturnAction *)&local_138);
  testing::internal::TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)>::
  WillRepeatedly(pTVar1,&local_128);
  testing::Action<pstore::serialize::archive::void_type_(const_int_&)>::~Action(&local_128);
  testing::internal::ReturnAction<pstore::serialize::archive::void_type>::~ReturnAction(&local_138);
  testing::internal::MockSpec<pstore::serialize::archive::void_type_(const_int_&)>::~MockSpec
            (&local_e0);
  testing::Matcher<const_int_&>::~Matcher(&local_f8);
  testing::Matcher<int&>::Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<int&> *)(arr._M_elems + 2),(AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_54ed9::ArchiveSpanFallback::archive_type::gmock_get
            (&local_160,(archive_type *)local_b8,(Matcher<int_&> *)(arr._M_elems + 2));
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<void_(int_&)>::operator()
                      (&local_160,(WithoutMatchers *)((long)arr._M_elems + 7),(void *)0x0);
  pcVar2 = "archive";
  this_03 = testing::internal::MockSpec<void_(int_&)>::InternalExpectedAt
                      (this_02,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                       ,0xf5,"archive","get (_)");
  testing::internal::TypedExpectation<void_(int_&)>::Times(this_03,0);
  testing::internal::MockSpec<void_(int_&)>::~MockSpec(&local_160);
  testing::Matcher<int_&>::~Matcher((Matcher<int_&> *)(arr._M_elems + 2));
  pstore::gsl::span<int,-1l>::span<3ul,int>
            ((span<int,_1l> *)&local_198,(array<int,_3UL> *)local_188);
  sp.storage_.data_ = (pointer)pcVar2;
  sp.storage_.super_extent_type<_1L>.size_ = local_190.size_;
  pstore::serialize::write<(anonymous_namespace)::ArchiveSpanFallback::archive_type&,int,_1l>
            ((serialize *)local_b8,local_198,sp);
  anon_unknown.dwarf_54ed9::ArchiveSpanFallback::archive_type::~archive_type
            ((archive_type *)local_b8);
  return;
}

Assistant:

TEST_F (ArchiveSpanFallback, Write) {
    using ::testing::_;
    using ::testing::Return;

    archive_type archive;
    auto const ret = pstore::serialize::archive::void_type{};
    EXPECT_CALL (archive.writer_policy (), put (_)).Times (3).WillRepeatedly (Return (ret));
    EXPECT_CALL (archive, get (_)).Times (0);

    std::array<int, 3> arr;
    pstore::serialize::write (archive, ::pstore::gsl::span<int> (arr));
}